

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskBuilder.cpp
# Opt level: O0

int __thiscall
DiskBuilder::LoadDisk
          (DiskBuilder *this,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list,
          IDisk **created_disk,ILoadingProgress *loading_progress)

{
  FormatType *pFVar1;
  bool bVar2;
  int iVar3;
  reference ppFVar4;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> local_58;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_40;
  __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
  local_38;
  iterator it;
  ILoadingProgress *loading_progress_local;
  IDisk **created_disk_local;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list_local;
  DiskBuilder *this_local;
  
  it._M_current = (FormatType **)loading_progress;
  local_38._M_current =
       (FormatType **)
       std::vector<FormatType_*,_std::allocator<FormatType_*>_>::begin(&this->format_list_);
  while( true ) {
    local_40._M_current =
         (FormatType **)
         std::vector<FormatType_*,_std::allocator<FormatType_*>_>::end(&this->format_list_);
    bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar2) {
      return -1;
    }
    ppFVar4 = __gnu_cxx::
              __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>
              ::operator*(&local_38);
    pFVar1 = *ppFVar4;
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::vector
              (&local_58,file_list);
    iVar3 = (*pFVar1->_vptr_FormatType[7])(pFVar1,&local_58,created_disk,it._M_current);
    std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::~vector(&local_58);
    if (iVar3 == 0) break;
    __gnu_cxx::
    __normal_iterator<FormatType_**,_std::vector<FormatType_*,_std::allocator<FormatType_*>_>_>::
    operator++(&local_38,0);
  }
  return 0;
}

Assistant:

int DiskBuilder::LoadDisk(std::vector<FormatType::TrackItem> file_list, IDisk*& created_disk,
                          ILoadingProgress* loading_progress)
{
   for (auto it = format_list_.begin(); it != format_list_.end(); it++)
   {
      if ((*it)->LoadDisk(file_list, created_disk, loading_progress) == 0)
         return 0;;
   }
   return -1;
}